

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O0

SockData * AGSSock::SockData_CreateFromString(char *str)

{
  SockData *__s;
  SockData *this;
  allocator<char> local_39;
  string local_38;
  SockData *local_18;
  SockData *data;
  char *str_local;
  
  data = (SockData *)str;
  this = (SockData *)operator_new(0x20);
  __s = data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,(char *)__s,&local_39);
  SockData::SockData(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = this;
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,this,&agsSockData);
  return local_18;
}

Assistant:

SockData *SockData_CreateFromString(const char *str)
{
	SockData *data = new SockData(str);
	AGS_OBJECT(SockData, data);
	return data;
}